

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * CLI::detail::remove_quotes(string *str)

{
  char cVar1;
  string *psVar2;
  ulong uVar3;
  char *pcVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined8 local_28;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  undefined8 local_18;
  string *local_10;
  string *str_local;
  
  local_10 = str;
  uVar3 = ::std::__cxx11::string::length();
  if ((1 < uVar3) &&
     ((pcVar4 = (char *)::std::__cxx11::string::front(), *pcVar4 == '\"' ||
      (pcVar4 = (char *)::std::__cxx11::string::front(), *pcVar4 == '\'')))) {
    pcVar4 = (char *)::std::__cxx11::string::front();
    cVar1 = *pcVar4;
    pcVar4 = (char *)::std::__cxx11::string::back();
    if (cVar1 == *pcVar4) {
      ::std::__cxx11::string::pop_back();
      psVar2 = local_10;
      local_20._M_current = (char *)::std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_18,&local_20);
      local_38._M_current = (char *)::std::__cxx11::string::begin();
      local_30 = __gnu_cxx::
                 __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator+(&local_38,1);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_28,&local_30);
      ::std::__cxx11::string::erase(psVar2,local_18,local_28);
    }
  }
  return local_10;
}

Assistant:

inline std::string &remove_quotes(std::string &str) {
    if(str.length() > 1 && (str.front() == '"' || str.front() == '\'')) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}